

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

CollectCallBack * __thiscall
DListBase<ThreadContext::CollectCallBack,_RealCount>::PrependNode<Memory::HeapAllocator>
          (DListBase<ThreadContext::CollectCallBack,_RealCount> *this,HeapAllocator *allocator)

{
  HeapAllocator *alloc;
  DListNode<ThreadContext::CollectCallBack> *this_00;
  DListNodeBase<ThreadContext::CollectCallBack> **ppDVar1;
  TrackAllocData local_50;
  DListNode<ThreadContext::CollectCallBack> *local_28;
  Node *newNode;
  HeapAllocator *allocator_local;
  DListBase<ThreadContext::CollectCallBack,_RealCount> *this_local;
  
  newNode = (Node *)allocator;
  allocator_local = (HeapAllocator *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&DListNode<ThreadContext::CollectCallBack>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
             ,0x10a);
  alloc = Memory::HeapAllocator::TrackAllocInfo(allocator,&local_50);
  this_00 = (DListNode<ThreadContext::CollectCallBack> *)
            new<Memory::HeapAllocator>(0x20,alloc,0x350bd0);
  DListNode<ThreadContext::CollectCallBack>::DListNode(this_00);
  if (this_00 == (DListNode<ThreadContext::CollectCallBack> *)0x0) {
    this_local = (DListBase<ThreadContext::CollectCallBack,_RealCount> *)0x0;
  }
  else {
    local_28 = this_00;
    ppDVar1 = DListNodeBase<ThreadContext::CollectCallBack>::Next
                        (&this->super_DListNodeBase<ThreadContext::CollectCallBack>);
    InsertNodeBefore(*ppDVar1,&local_28->super_DListNodeBase<ThreadContext::CollectCallBack>);
    RealCount::IncrementCount(&this->super_RealCount);
    this_local = (DListBase<ThreadContext::CollectCallBack,_RealCount> *)&local_28->data;
  }
  return (CollectCallBack *)this_local;
}

Assistant:

TData * PrependNode(TAllocator * allocator)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node);
        if (newNode)
        {
            DListBase::InsertNodeBefore(this->Next(), newNode);
            this->IncrementCount();
            return &newNode->data;
        }
        return nullptr;
    }